

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O0

USHORT __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::ZeroPageQueue::QueryDepth(ZeroPageQueue *this)

{
  USHORT UVar1;
  size_t count;
  FreePageEntry *head;
  AutoCriticalSection autoCS;
  ZeroPageQueue *this_local;
  
  autoCS.cs = (CriticalSection *)this;
  AutoCriticalSection::AutoCriticalSection
            ((AutoCriticalSection *)&head,
             &(this->super_BackgroundPageQueue).backgroundPageQueueCriticalSection);
  UVar1 = 0;
  for (count = (size_t)this->pendingZeroPageList; count != 0; count = *(size_t *)count) {
    UVar1 = UVar1 + 1;
  }
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&head);
  return UVar1;
}

Assistant:

USHORT QueryDepth()
        {
#if SUPPORT_WIN32_SLIST
            return QueryDepthSList(&pendingZeroPageList);
#else
            AutoCriticalSection autoCS(&this->backgroundPageQueueCriticalSection);
            FreePageEntry* head = pendingZeroPageList;
            size_t count = 0;
            while (head)
            {
                head = head->Next;
                count++;
            }
            // If the specified singly linked list contains more than 65535 entries, QueryDepthSList returns the number of entries in the list modulo 65535
            return (USHORT)(count % 65536);
#endif
        }